

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O1

void __thiscall rsg::Shader::tokenize(Shader *this,GeneratorState *state,TokenStream *str)

{
  size_t sVar1;
  size_t sVar2;
  Statement *pSVar3;
  bool bVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  Token local_78;
  Token local_68;
  Token local_58;
  Token local_48;
  Token local_38;
  
  if (state->m_shader->m_type == TYPE_FRAGMENT) {
    local_78.m_type = PRECISION;
    if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
      std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                (&str->m_tokens,str->m_numTokens + 0x40);
    }
    Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                     _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_78);
    sVar2 = str->m_numTokens;
    sVar1 = sVar2 + 1;
    str->m_numTokens = sVar1;
    local_38.m_type = MEDIUM_PRECISION;
    if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_start >> 4 == sVar1) {
      std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar2 + 0x41);
    }
    Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                     _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_38);
    sVar2 = str->m_numTokens;
    sVar1 = sVar2 + 1;
    str->m_numTokens = sVar1;
    local_48.m_type = FLOAT;
    if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_start >> 4 == sVar1) {
      std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar2 + 0x41);
    }
    Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                     _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_48);
    sVar2 = str->m_numTokens;
    sVar1 = sVar2 + 1;
    str->m_numTokens = sVar1;
    local_58.m_type = SEMICOLON;
    if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_start >> 4 == sVar1) {
      std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar2 + 0x41);
    }
    Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                     _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_58);
    sVar2 = str->m_numTokens;
    sVar1 = sVar2 + 1;
    str->m_numTokens = sVar1;
    local_68.m_type = NEWLINE;
    if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
              super__Vector_impl_data._M_start >> 4 == sVar1) {
      std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize(&str->m_tokens,sVar2 + 0x41);
    }
    Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                     _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_68);
    str->m_numTokens = str->m_numTokens + 1;
    Token::~Token(&local_68);
    Token::~Token(&local_58);
    Token::~Token(&local_48);
    Token::~Token(&local_38);
    Token::~Token(&local_78);
  }
  uVar5 = (int)((ulong)((long)(this->m_globalStatements).
                              super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_globalStatements).
                             super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
  if (-1 < (int)uVar5) {
    lVar6 = (ulong)uVar5 + 1;
    do {
      pSVar3 = (this->m_globalStatements).
               super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>._M_impl.
               super__Vector_impl_data._M_start[lVar6 + -1];
      (*pSVar3->_vptr_Statement[3])(pSVar3,state,str);
      lVar7 = lVar6 + -1;
      bVar4 = 0 < lVar6;
      lVar6 = lVar7;
    } while (lVar7 != 0 && bVar4);
  }
  uVar5 = (int)((ulong)((long)(this->m_functions).
                              super__Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_functions).
                             super__Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
  if (-1 < (int)uVar5) {
    lVar6 = (ulong)uVar5 + 1;
    do {
      local_78.m_type = NEWLINE;
      if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
                super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
        std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
                  (&str->m_tokens,str->m_numTokens + 0x40);
      }
      Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                       _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_78);
      str->m_numTokens = str->m_numTokens + 1;
      Token::~Token(&local_78);
      Function::tokenize((this->m_functions).
                         super__Vector_base<rsg::Function_*,_std::allocator<rsg::Function_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar6 + -1],state,str);
      lVar7 = lVar6 + -1;
      bVar4 = 0 < lVar6;
      lVar6 = lVar7;
    } while (lVar7 != 0 && bVar4);
  }
  local_78.m_type = NEWLINE;
  if ((long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>._M_impl.
            super__Vector_impl_data._M_start >> 4 == str->m_numTokens) {
    std::vector<rsg::Token,_std::allocator<rsg::Token>_>::resize
              (&str->m_tokens,str->m_numTokens + 0x40);
  }
  Token::operator=((str->m_tokens).super__Vector_base<rsg::Token,_std::allocator<rsg::Token>_>.
                   _M_impl.super__Vector_impl_data._M_start + str->m_numTokens,&local_78);
  str->m_numTokens = str->m_numTokens + 1;
  Token::~Token(&local_78);
  Function::tokenize(&this->m_mainFunction,state,str);
  return;
}

Assistant:

void Shader::tokenize (GeneratorState& state, TokenStream& str) const
{
	// Add default precision for float in fragment shaders \todo [pyry] Proper precision handling
	if (state.getShader().getType() == Shader::TYPE_FRAGMENT)
		str << Token::PRECISION << Token::MEDIUM_PRECISION << Token::FLOAT << Token::SEMICOLON << Token::NEWLINE;

	// Tokenize global declaration statements
	for (int ndx = (int)m_globalStatements.size()-1; ndx >= 0; ndx--)
		m_globalStatements[ndx]->tokenize(state, str);

	// Tokenize all functions
	for (int ndx = (int)m_functions.size()-1; ndx >= 0; ndx--)
	{
		str << Token::NEWLINE;
		m_functions[ndx]->tokenize(state, str);
	}

	// Tokenize main
	str << Token::NEWLINE;
	m_mainFunction.tokenize(state, str);
}